

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mismatch_suite.cpp
# Opt level: O3

void test_u32string(void)

{
  bool v;
  size_type sVar1;
  long lVar2;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  *this;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  variable second;
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  range;
  variable first;
  undefined4 local_7cc;
  type local_7c8;
  undefined1 local_7a8;
  undefined1 local_798 [8];
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  local_790;
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  local_778 [16];
  undefined1 local_768 [24];
  undefined1 local_750 [24];
  undefined1 local_738 [24];
  undefined1 local_720 [24];
  undefined1 local_708 [24];
  undefined1 local_6f0 [24];
  undefined1 local_6d8 [24];
  undefined1 local_6c0 [24];
  undefined1 local_6a8 [24];
  undefined1 local_690 [24];
  undefined1 local_678 [24];
  undefined1 local_660 [24];
  undefined1 local_648 [24];
  undefined1 local_630 [24];
  undefined1 local_618 [24];
  undefined1 local_600 [24];
  undefined1 local_5e8 [24];
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [24];
  undefined1 local_5a0 [24];
  undefined1 local_588 [24];
  undefined1 local_570 [24];
  undefined1 local_558 [24];
  undefined1 local_540 [24];
  undefined1 local_528 [24];
  undefined1 local_510 [24];
  undefined1 local_4f8 [24];
  undefined1 local_4e0 [24];
  undefined1 local_4c8 [24];
  undefined1 local_4b0 [24];
  undefined1 local_498 [24];
  undefined1 local_480 [24];
  undefined1 local_468 [24];
  undefined1 local_450 [24];
  undefined1 local_438 [24];
  undefined1 local_420 [24];
  undefined1 local_408 [24];
  undefined1 local_3f0 [24];
  undefined1 local_3d8 [24];
  undefined1 local_3c0 [24];
  undefined1 local_3a8 [32];
  type local_388 [2];
  undefined4 local_378;
  undefined1 local_358;
  type local_348;
  undefined1 local_328;
  type local_318;
  undefined1 local_2f8;
  basic_variable<std::allocator<char>_> local_2e8;
  type local_2b8;
  undefined1 local_298;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  undefined1 local_168 [104];
  undefined1 local_100 [16];
  uchar local_f0;
  undefined1 local_e8 [16];
  uchar local_d8;
  undefined1 local_d0 [16];
  index_type local_c0;
  undefined1 local_b8 [16];
  index_type local_a8;
  undefined1 local_a0 [16];
  index_type local_90;
  undefined1 local_88 [16];
  index_type local_78;
  undefined1 local_70 [16];
  index_type local_60;
  undefined1 local_58 [16];
  index_type local_48;
  undefined1 local_40 [16];
  index_type local_30;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  local_7a8 = 1;
  local_7c8.__data[0] = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_3c0,(basic_variable<std::allocator<char>_> *)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_3d8,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_3f0,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_3c0,(iterator *)local_3d8,(iterator *)local_3f0);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_3f0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_3d8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_3c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_408,(pointer)local_3a8,true);
  local_40._0_8_ = local_798;
  local_30 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_40 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_408,(iterator *)local_40);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x270,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_40 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_408 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  local_7a8 = 6;
  local_7c8._0_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_420,(basic_variable<std::allocator<char>_> *)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_438,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_450,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_420,(iterator *)local_438,(iterator *)local_450);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_450 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_438 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_420 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_468,(pointer)local_3a8,true);
  local_58._0_8_ = local_798;
  local_48 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_58 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_468,(iterator *)local_58);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x277,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_58 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_468 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  local_7a8 = 0xd;
  local_7c8._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_480,(basic_variable<std::allocator<char>_> *)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_498,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_4b0,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_480,(iterator *)local_498,(iterator *)local_4b0);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_4b0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_498 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_480 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_4c8,(pointer)local_3a8,true);
  local_70._0_8_ = local_798;
  local_60 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_4c8,(iterator *)local_70);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x27e,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_70 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_4c8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_4e0,(pointer)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_4f8,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_510,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_4e0,(iterator *)local_4f8,(iterator *)local_510);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_510 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_4f8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_4e0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_528,(pointer)local_3a8,true);
  local_88._0_8_ = local_798;
  local_78 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_88 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_528,(iterator *)local_88);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x285,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_88 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_528 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_540,(pointer)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_558,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_570,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_540,(iterator *)local_558,(iterator *)local_570);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_570 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_558 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_540 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_588,(pointer)local_3a8,true);
  local_a0._0_8_ = local_798;
  local_90 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_a0 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_588,(iterator *)local_a0);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x28c,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_a0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_588 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_5a0,(pointer)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_5b8,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_5d0,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_5a0,(iterator *)local_5b8,(iterator *)local_5d0);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_5d0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_5b8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_5a0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_5e8,(pointer)local_3a8,true);
  local_b8._0_8_ = local_798;
  local_a8 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_b8 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_5e8,(iterator *)local_b8);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x293,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_b8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_5e8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_600,(pointer)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_618,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_630,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_600,(iterator *)local_618,(iterator *)local_630);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_630 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_618 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_600 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_768,(pointer)local_3a8,false);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_798,(iterator *)local_768);
  boost::detail::test_impl
            ("range.first == first.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x29a,"void test_u32string()",v);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_768 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_648,(pointer)local_3a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_660,(pointer)local_3a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_678,(pointer)&local_7c8.__align,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_798,(iterator *)local_648,(iterator *)local_660,(iterator *)local_678);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_678 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_660 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_648 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_690,(pointer)local_3a8,true);
  local_d0._0_8_ = local_798;
  local_c0 = local_790.current;
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_d0 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_798 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_690,(iterator *)local_d0);
  local_7cc = 0;
  sVar1 = 0x2a0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2a0,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_d0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_690 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            (local_778);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_798 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"delta");
  local_388[0].__data[0] = '\x01';
  local_3a8[0] = '\x01';
  local_358 = 6;
  local_378 = 2;
  local_328 = 0xd;
  local_348._0_8_ = 0x4008000000000000;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_318.__align,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_2b8.__align,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_288.first,L"delta");
  init._M_len = sVar1;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_798,
             (basic_array<std::allocator<char>_> *)local_3a8,init);
  lVar2 = 0x120;
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                *)(local_3a8 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_6a8,(pointer)&local_7c8.__align,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_6c0,(pointer)&local_7c8.__align,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_6d8,(pointer)local_798,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_3a8,(iterator *)local_6a8,(iterator *)local_6c0,(iterator *)local_6d8);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_6d8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_6c0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_6a8 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_6f0,(pointer)&local_7c8.__align,true);
  local_e8._0_8_ = CONCAT71(local_3a8._1_7_,local_3a8[0]);
  local_d8 = local_3a8[0x10];
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_e8 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_3a8 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_6f0,(iterator *)local_e8);
  local_7cc = 0;
  sVar1 = 0x2a7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2a7,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_e8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_6f0 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)&local_388[0].__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_3a8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_798);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_7c8.__align,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,"alpha");
  local_358 = 1;
  local_378 = CONCAT31(local_378._1_3_,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_348.__align,"bravo");
  local_2f8 = 6;
  local_318._0_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,"charlie");
  local_298 = 0xd;
  local_2b8._0_8_ = 0x4008000000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (&local_288,(char (*) [6])"delta",(char (*) [9])"hydrogen");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (&local_228,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (&local_1c8,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_168,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x7;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_798,
             (basic_map<std::allocator<char>_> *)local_3a8,init_00);
  lVar2 = -0x2a0;
  this = (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          *)(local_168 + 0x30);
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              (this);
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              (this + -0x30);
    this = this + -0x60;
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_708,(pointer)&local_7c8.__align,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_720,(pointer)&local_7c8.__align,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_738,(pointer)local_798,true);
  std::
  mismatch<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_3a8,(iterator *)local_708,(iterator *)local_720,(iterator *)local_738);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_738 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_720 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_708 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   *)local_750,(pointer)&local_7c8.__align,true);
  local_100._0_8_ = CONCAT71(local_3a8._1_7_,local_3a8[0]);
  local_f0 = local_3a8[0x10];
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::copier,void,trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>const&>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_100 + 8),
             (small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              *)(local_3a8 + 8));
  local_768._0_8_ =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 ((iterator *)local_750,(iterator *)local_100);
  local_7cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(first.begin(), range.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/mismatch_suite.cpp"
             ,0x2b7,"void test_u32string()",local_768,&local_7cc);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_100 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_750 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)&local_388[0].__align);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
              *)(local_3a8 + 8));
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)local_798);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_7c8.__align);
  return;
}

Assistant:

void test_u32string()
{
    // u32string - boolean
    {
        variable first(U"delta");
        variable second(true);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - integer
    {
        variable first(U"delta");
        variable second(2);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - real
    {
        variable first(U"delta");
        variable second(3.0);
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - string
    {
        variable first(U"delta");
        variable second("alpha");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - wstring
    {
        variable first(U"delta");
        variable second(L"bravo");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - u16string
    {
        variable first(U"delta");
        variable second(u"charlie");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - u32string
    {
        variable first(U"delta");
        variable second(U"delta");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST(range.first == first.end());
    }
    {
        variable first(U"delta");
        variable second(U"zulu");
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - array
    {
        variable first(U"delta");
        variable second = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
    // u32string - map
    {
        variable first(U"delta");
        variable second = map::make(
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "delta", "hydrogen" },
            { "echo", L"helium" },
            { "foxtrot", u"lithium" },
            { "golf", U"beryllium" }
        });
        auto range = std::mismatch(first.begin(), first.end(), second.begin());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(first.begin(), range.first), 0);
    }
}